

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathFreeNodeSet(xmlNodeSetPtr obj)

{
  xmlNodePtr ns;
  int iVar1;
  xmlNodePtr *ppxVar2;
  long lVar3;
  
  if (obj != (xmlNodeSetPtr)0x0) {
    ppxVar2 = obj->nodeTab;
    if (ppxVar2 != (xmlNodePtr *)0x0) {
      iVar1 = obj->nodeNr;
      if (0 < iVar1) {
        lVar3 = 0;
        do {
          ns = obj->nodeTab[lVar3];
          if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
            iVar1 = obj->nodeNr;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar1);
        ppxVar2 = obj->nodeTab;
      }
      (*xmlFree)(ppxVar2);
    }
    (*xmlFree)(obj);
    return;
  }
  return;
}

Assistant:

void
xmlXPathFreeNodeSet(xmlNodeSetPtr obj) {
    if (obj == NULL) return;
    if (obj->nodeTab != NULL) {
	int i;

	/* @@ with_ns to check whether namespace nodes should be looked at @@ */
	for (i = 0;i < obj->nodeNr;i++)
	    if ((obj->nodeTab[i] != NULL) &&
		(obj->nodeTab[i]->type == XML_NAMESPACE_DECL))
		xmlXPathNodeSetFreeNs((xmlNsPtr) obj->nodeTab[i]);
	xmlFree(obj->nodeTab);
    }
    xmlFree(obj);
}